

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O3

bool operator==(Person *a,Person *b)

{
  size_t __n;
  int iVar1;
  
  if ((a->age == b->age) && (__n = (a->name)._M_string_length, __n == (b->name)._M_string_length)) {
    if (__n != 0) {
      iVar1 = bcmp((a->name)._M_dataplus._M_p,(b->name)._M_dataplus._M_p,__n);
      return iVar1 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool operator==(const Person& a, const Person& b)
{
  return a.age == b.age && a.name == b.name;
}